

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::FloatConstOpnd::IsEqualInternal(FloatConstOpnd *this,Opnd *opnd)

{
  double dVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  undefined4 *puVar6;
  FloatConstOpnd *pFVar7;
  Opnd *opnd_local;
  FloatConstOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindFloatConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x709,"(m_kind == OpndKindFloatConst)","m_kind == OpndKindFloatConst");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = Opnd::IsFloatConstOpnd(opnd);
  if (bVar3) {
    IVar4 = Opnd::GetType(&this->super_Opnd);
    IVar5 = Opnd::GetType(opnd);
    if (IVar4 == IVar5) {
      dVar1 = this->m_value;
      pFVar7 = Opnd::AsFloatConstOpnd(opnd);
      return dVar1 == pFVar7->m_value;
    }
  }
  return false;
}

Assistant:

bool
FloatConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindFloatConst);
    if (!opnd->IsFloatConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsFloatConstOpnd()->m_value;
}